

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

int __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
::select_variables(solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>
                   *this,rc_size *sizes,int bkmin,int bkmax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  double dVar7;
  
  iVar1 = sizes->c_size;
  iVar3 = iVar1 + bkmin;
  if (bkmin == bkmax) {
    iVar2 = iVar3;
    if (sizes->r_size < iVar3) {
      iVar2 = sizes->r_size;
    }
  }
  else {
    iVar2 = bkmax + iVar1;
    if (sizes->r_size < bkmax + iVar1) {
      iVar2 = sizes->r_size;
    }
    if (iVar3 <= iVar2) {
      bVar5 = false;
      lVar6 = ((long)iVar1 + (long)bkmin) * 0x10;
      lVar4 = (long)iVar1 + (long)bkmin;
      do {
        dVar7 = *(double *)
                 ((long)&((this->R)._M_t.
                          super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_false>::rc_data_*,_false>
                         ._M_head_impl)->value + lVar6);
        if ((dVar7 != 0.0) || (NAN(dVar7))) {
          if (dVar7 < 0.0) goto LAB_0047de29;
        }
        else {
          dVar7 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (this->rng);
          if (dVar7 < 0.5) {
LAB_0047de29:
            if (!bVar5) {
              iVar2 = iVar3;
            }
            break;
          }
        }
        bVar5 = iVar2 <= lVar4;
        iVar3 = iVar3 + 1;
        lVar6 = lVar6 + 0x10;
        lVar4 = lVar4 + 1;
      } while (iVar2 + 1 != iVar3);
    }
  }
  return iVar2 + -1;
}

Assistant:

int select_variables(const rc_size& sizes, int bkmin, int bkmax)
    {
        if (bkmin == bkmax)
            return std::min(bkmin + sizes.c_size, sizes.r_size) - 1;

        bkmin += sizes.c_size;
        bkmax = std::min(bkmax + sizes.c_size, sizes.r_size);

        for (int i = bkmin; i <= bkmax; ++i)
            if (stop_iterating<Mode>(R[i].value, rng))
                return i - 1;

        return bkmax - 1;
    }